

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_srv_cm.c
# Opt level: O1

int isobusfs_srv_request_volume
              (isobusfs_srv_priv *priv,isobusfs_srv_client *client,isobusfs_srv_volume *volume)

{
  long lVar1;
  
  lVar1 = 3;
  do {
    if (volume->clients[lVar1 + -3] == client) {
      return 0;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xf0);
  lVar1 = 3;
  do {
    if (volume->clients[lVar1 + -3] == (isobusfs_srv_client *)0x0) {
      volume->clients[lVar1 + -3] = client;
      volume->refcount = volume->refcount + 1;
      return 0;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xf0);
  return -2;
}

Assistant:

int isobusfs_srv_request_volume(struct isobusfs_srv_priv *priv,
				struct isobusfs_srv_client *client,
				struct isobusfs_srv_volume *volume)
{
	unsigned int j;

	/* Check if the client already requested this volume */
	for (j = 0; j < ARRAY_SIZE(volume->clients); j++) {
		if (volume->clients[j] == client) {
			/* Client already requested this volume, do not
			 * increase refcount 
			 */
			return 0;
		}
	}

	/* Add client to the volume's client list and increase refcount */
	for (j = 0; j < ARRAY_SIZE(volume->clients); j++) {
		if (volume->clients[j] == NULL) {
			volume->clients[j] = client;
			volume->refcount++;
			return 0;
		}
	}

	return -ENOENT;
}